

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetAliases(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Base_ptr *__lhs;
  cmNinjaDeps *this_00;
  bool bVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  size_type sVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  undefined4 extraout_var_00;
  _Base_ptr p_Var7;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer __k;
  cmNinjaBuild build;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  cmNinjaBuild local_170;
  string local_50;
  ostream *os_00;
  
  WriteDivider(os);
  std::operator<<(os,"# Target aliases.\n\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"phony",(allocator<char> *)&local_188);
  cmNinjaBuild::cmNinjaBuild(&local_170,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&local_170.Outputs);
  p_Var5 = (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = &local_170.ExplicitDeps;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(this->TargetAliases)._M_t._M_impl.super__Rb_tree_header) {
      iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x26])(this);
      if ((char)iVar2 != '\0') {
        cmMakefile::GetGeneratorConfigs_abi_cxx11_
                  (&local_188,
                   (cmMakefile *)
                   (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                     super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
                   IncludeEmptyConfig);
        for (__k = local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            __k != local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                   ::operator[](&this->Configs,__k);
          for (p_Var5 = (pmVar6->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
              ; (_Rb_tree_header *)p_Var5 !=
                &(pmVar6->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
            if (*(long *)(p_Var5 + 2) != 0) {
              bVar1 = HasCustomCommandOutput(this,(string *)(p_Var5 + 1));
              if (!bVar1) {
                std::__cxx11::string::_M_assign
                          ((string *)
                           local_170.Outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(this_00);
                AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var5 + 2),this_00,__k,
                                    DependOnTargetArtifact);
                iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          _vptr_cmGlobalGenerator[0x42])(this,__k);
                WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar2),&local_170,0,(bool *)0x0)
                ;
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_188);
        if ((this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          for (p_Var5 = (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              (_Rb_tree_header *)p_Var5 !=
              &(this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header;
              p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
            if (*(long *)(p_Var5 + 2) != 0) {
              bVar1 = HasCustomCommandOutput(this,(string *)(p_Var5 + 1));
              if (!bVar1) {
                std::__cxx11::string::_M_assign
                          ((string *)
                           local_170.Outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::clear(this_00);
                for (p_Var7 = (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left;
                    (_Rb_tree_header *)p_Var7 !=
                    &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header;
                    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
                  AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var5 + 2),this_00,
                                      (string *)(p_Var7 + 1),DependOnTargetArtifact);
                }
                iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          _vptr_cmGlobalGenerator[0x43])(this);
                WriteBuild(this,(ostream *)CONCAT44(extraout_var_01,iVar2),&local_170,0,(bool *)0x0)
                ;
              }
            }
          }
        }
      }
      cmNinjaBuild::~cmNinjaBuild(&local_170);
      return;
    }
    if (*(long *)(p_Var5 + 2) != 0) {
      bVar1 = HasCustomCommandOutput(this,(string *)(p_Var5 + 1));
      if (!bVar1) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   local_170.Outputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(this_00);
        __lhs = &p_Var5[2]._M_parent;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"all");
        if (bVar1) {
          for (p_Var3 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var3 != &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
              p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
            AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var5 + 2),this_00,
                                (string *)(p_Var3 + 1),DependOnTargetArtifact);
          }
        }
        else {
          AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var5 + 2),this_00,(string *)__lhs,
                              DependOnTargetArtifact);
        }
        if ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_002e13d0:
          iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x41])(this,__lhs);
          os_00 = (ostream *)CONCAT44(extraout_var,iVar2);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"all");
          os_00 = os;
          if (!bVar1) {
            sVar4 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this->CrossConfigs,(key_type *)__lhs);
            if (sVar4 == 0) goto LAB_002e13d0;
          }
        }
        WriteBuild(this,os_00,&local_170,0,(bool *)0x0);
      }
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetAliases(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Target aliases.\n\n";

  cmNinjaBuild build("phony");
  build.Outputs.emplace_back();
  for (auto const& ta : this->TargetAliases) {
    // Don't write ambiguous aliases.
    if (!ta.second.GeneratorTarget) {
      continue;
    }

    // Don't write alias if there is a already a custom command with
    // matching output
    if (this->HasCustomCommandOutput(ta.first)) {
      continue;
    }

    build.Outputs.front() = ta.first;
    build.ExplicitDeps.clear();
    if (ta.second.Config == "all") {
      for (auto const& config : this->CrossConfigs) {
        this->AppendTargetOutputs(ta.second.GeneratorTarget,
                                  build.ExplicitDeps, config,
                                  DependOnTargetArtifact);
      }
    } else {
      this->AppendTargetOutputs(ta.second.GeneratorTarget, build.ExplicitDeps,
                                ta.second.Config, DependOnTargetArtifact);
    }
    this->WriteBuild(this->EnableCrossConfigBuild() &&
                         (ta.second.Config == "all" ||
                          this->CrossConfigs.count(ta.second.Config))
                       ? os
                       : *this->GetImplFileStream(ta.second.Config),
                     build);
  }

  if (this->IsMultiConfig()) {
    for (auto const& config : this->Makefiles.front()->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      for (auto const& ta : this->Configs[config].TargetAliases) {
        // Don't write ambiguous aliases.
        if (!ta.second.GeneratorTarget) {
          continue;
        }

        // Don't write alias if there is a already a custom command with
        // matching output
        if (this->HasCustomCommandOutput(ta.first)) {
          continue;
        }

        build.Outputs.front() = ta.first;
        build.ExplicitDeps.clear();
        this->AppendTargetOutputs(ta.second.GeneratorTarget,
                                  build.ExplicitDeps, config,
                                  DependOnTargetArtifact);
        this->WriteBuild(*this->GetConfigFileStream(config), build);
      }
    }

    if (!this->DefaultConfigs.empty()) {
      for (auto const& ta : this->DefaultTargetAliases) {
        // Don't write ambiguous aliases.
        if (!ta.second.GeneratorTarget) {
          continue;
        }

        // Don't write alias if there is a already a custom command with
        // matching output
        if (this->HasCustomCommandOutput(ta.first)) {
          continue;
        }

        build.Outputs.front() = ta.first;
        build.ExplicitDeps.clear();
        for (auto const& config : this->DefaultConfigs) {
          this->AppendTargetOutputs(ta.second.GeneratorTarget,
                                    build.ExplicitDeps, config,
                                    DependOnTargetArtifact);
        }
        this->WriteBuild(*this->GetDefaultFileStream(), build);
      }
    }
  }
}